

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderInvariance.cpp
# Opt level: O0

bool __thiscall
glcts::TessellationShaderInvarianceRule7Test::isTriangleDefinedInVertexDataSet
          (TessellationShaderInvarianceRule7Test *this,float *base_triangle_data,float *vertex_data,
          uint vertex_data_n_vertices)

{
  bool bVar1;
  float *current_triangle_data;
  uint n_triangle;
  bool result;
  uint vertex_data_n_vertices_local;
  float *vertex_data_local;
  float *base_triangle_data_local;
  TessellationShaderInvarianceRule7Test *this_local;
  
  current_triangle_data._4_4_ = 0;
  while( true ) {
    if (vertex_data_n_vertices / 3 <= current_triangle_data._4_4_) {
      return false;
    }
    bVar1 = TessellationShaderUtils::isTriangleDefined
                      (vertex_data + current_triangle_data._4_4_ * 9,base_triangle_data);
    if (bVar1) break;
    current_triangle_data._4_4_ = current_triangle_data._4_4_ + 1;
  }
  return true;
}

Assistant:

bool TessellationShaderInvarianceRule7Test::isTriangleDefinedInVertexDataSet(const float* base_triangle_data,
																			 const float* vertex_data,
																			 unsigned int vertex_data_n_vertices)
{
	bool result = false;

	for (unsigned int n_triangle = 0; n_triangle < vertex_data_n_vertices / 3 /* vertices per triangle */; n_triangle++)
	{
		const float* current_triangle_data = vertex_data +
											 n_triangle * 3 * /* vertices per triangle */
												 3;			  /* components */

		if (TessellationShaderUtils::isTriangleDefined(current_triangle_data, base_triangle_data))
		{
			result = true;

			break;
		}
	} /* for (all vertices) */

	return result;
}